

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrfile.c
# Opt level: O2

int file_openfile(char *filename,int rwmode,FILE **diskfile)

{
  long lVar1;
  char cVar2;
  char *__s;
  size_t sVar3;
  passwd *ppVar4;
  size_t sVar5;
  FILE *pFVar6;
  int iVar7;
  ulong uVar8;
  char *__dest;
  char *__s_00;
  char mode [4];
  char user [80];
  char tempname [1024];
  
  if (rwmode == 1) {
    builtin_strncpy(mode,"r+b",4);
  }
  else {
    mode._2_2_ = mode._2_2_ & 0xff00;
    mode[0] = 'r';
    mode[1] = 'b';
  }
  iVar7 = 0x68;
  __dest = filename;
  if (*filename == '~') {
    __s_00 = filename + 1;
    cVar2 = filename[1];
    if (cVar2 == '/') {
      __s = getenv("HOME");
      if (__s == (char *)0x0) {
        sVar3 = strlen(filename);
        if (0x3ff < sVar3) {
          return 0x68;
        }
        __dest = tempname;
        strcpy(__dest,filename);
        goto LAB_00115e02;
      }
      sVar3 = strlen(__s);
    }
    else {
      uVar8 = 0;
      while ((cVar2 != '\0' && (cVar2 != '/'))) {
        user[uVar8] = cVar2;
        lVar1 = uVar8 + 2;
        uVar8 = uVar8 + 1;
        cVar2 = filename[lVar1];
      }
      user[uVar8 & 0xffffffff] = '\0';
      ppVar4 = getpwnam(user);
      __s = ppVar4->pw_dir;
      sVar3 = strlen(__s);
      __s_00 = __s_00 + uVar8;
    }
    sVar5 = strlen(__s_00);
    if (0x3ff < sVar5 + sVar3) {
      return 0x68;
    }
    __dest = tempname;
    strcpy(__dest,__s);
    strcat(__dest,__s_00);
  }
LAB_00115e02:
  pFVar6 = fopen64(__dest,mode);
  *diskfile = (FILE *)pFVar6;
  if (pFVar6 != (FILE *)0x0) {
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int file_openfile(char *filename, int rwmode, FILE **diskfile)
/*
   lowest level routine to physically open a disk file
*/
{
#if defined(_WIN32)
    wchar_t mode[4];
#else
    char mode[4];
#endif


#if defined(unix) || defined(__unix__) || defined(__unix)
    char tempname[1024], *cptr, user[80];
    struct passwd *pwd;
    int ii = 0;

#if defined(REPLACE_LINKS)
    struct stat stbuf;
    int success = 0;
    size_t n;
    FILE *f1, *f2;
    char buf[BUFSIZ];
#endif

#endif

#if defined(_WIN32)
    if (rwmode == READWRITE)
    {
        wcscpy(mode, L"r+b");    /* open existing file with read-write */
    }
    else
    {
        wcscpy(mode, L"rb");     /* open existing file readonly */
    }
#else
    if (rwmode == READWRITE)
    {
          strcpy(mode, "r+b");    /* open existing file with read-write */
    }
    else
    {
          strcpy(mode, "rb");     /* open existing file readonly */
    }
#endif

#if MACHINE == ALPHAVMS || MACHINE == VAXVMS
        /* specify VMS record structure: fixed format, 2880 byte records */
        /* but force stream mode access to enable random I/O access      */
    *diskfile = fopen(filename, mode, "rfm=fix", "mrs=2880", "ctx=stm"); 

#elif defined(unix) || defined(__unix__) || defined(__unix)

    /* support the ~user/file.fits or ~/file.fits filenames in UNIX */

    if (*filename == '~')
    {
        if (filename[1] == '/')
        {
            cptr = getenv("HOME");
            if (cptr)
            {
                 if (strlen(cptr) + strlen(filename+1) > 1023)
		      return(FILE_NOT_OPENED); 

                 strcpy(tempname, cptr);
                 strcat(tempname, filename+1);
            }
            else
            {
                 if (strlen(filename) > 1023)
		      return(FILE_NOT_OPENED); 

                 strcpy(tempname, filename);
            }
        }
        else
        {
            /* copy user name */
            cptr = filename+1;
            while (*cptr && (*cptr != '/'))
            {
                user[ii] = *cptr;
                cptr++;
                ii++;
            }
            user[ii] = '\0';

            /* get structure that includes name of user's home directory */
            pwd = getpwnam(user);

            /* copy user's home directory */
            if (strlen(pwd->pw_dir) + strlen(cptr) > 1023)
		      return(FILE_NOT_OPENED); 

            strcpy(tempname, pwd->pw_dir);
            strcat(tempname, cptr);
        }

        *diskfile = fopen(tempname, mode); 
    }
    else
    {
        /* don't need to expand the input file name */
        *diskfile = fopen(filename, mode); 

#if defined(REPLACE_LINKS)

        if (!(*diskfile) && (rwmode == READWRITE))  
        {
           /* failed to open file with READWRITE privilege.  Test if  */
           /* the file we are trying to open is a soft link to a file that */
           /* doesn't have write privilege.  */

           lstat(filename, &stbuf);
           if ((stbuf.st_mode & S_IFMT) == S_IFLNK) /* is this a soft link? */
           {
              if ((f1 = fopen(filename, "rb")) != 0) /* try opening READONLY */
              {

                 if (strlen(filename) + 7 > 1023)
		      return(FILE_NOT_OPENED); 

                 strcpy(tempname, filename);
                 strcat(tempname, ".TmxFil");
                 if ((f2 = fopen(tempname, "wb")) != 0) /* create temp file */
                 {
                    success = 1;
                    while ((n = fread(buf, 1, BUFSIZ, f1)) > 0)
                    {
                       /* copy linked file to local temporary file */
                       if (fwrite(buf, 1, n, f2) != n) 
                       {
                          success = 0;
                          break;
                       } 
                    }
                    fclose(f2);
                 }
                 fclose(f1);
  
                 if (success)
                 {
                    /* delete link and rename temp file to previous link name */
                    remove(filename);
                    rename(tempname, filename);

                    /* try once again to open the file with write access */
                    *diskfile = fopen(filename, mode); 
                 }
                 else
                    remove(tempname);  /* clean up the failed copy */
              }
           }
        }
#endif

    }

#elif defined(_WIN32)
    /* Windows 
    * 
	*  Assume that the input filename is in UTF-8 encoding and convert to UTF-16.
   	*/
    {
        UINT inputCodePage = CP_UTF8;
        /*
        *  For UTF-8, dwFlags must be set to either 0 or
        *  MB_ERR_INVALID_CHARS.
        */
        DWORD flags = 0;
        int outputLength = 0, rc = 0;
        /*
        *  Call MultiByteToWideChar with an output buffer size of zero to determine
        *  how large an output buffer is actually necessary.
        */
        outputLength = MultiByteToWideChar(
            inputCodePage,
            flags,
            filename,
            -1,
            NULL,
            0
        );

        /*
        *  Actually convert the file name to UTF-16
        */
        wchar_t *wideFilename = (wchar_t*)malloc(sizeof(wchar_t) * outputLength);

        rc = MultiByteToWideChar(
            inputCodePage,
            flags,
            filename,
            -1,
            wideFilename,
            outputLength
        );

        /*
        *  If the conversion worked, open the file.
        */
        if (0 != rc)
            *diskfile = _wfopen(wideFilename, mode);
        free(wideFilename);
    }
#else
    /* other non-UNIX machines */
	*diskfile = fopen(filename, mode);
#endif


    if (!(*diskfile))           /* couldn't open file */
    {
            return(FILE_NOT_OPENED); 
    }
    return(0);
}